

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

int __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderGroup::init(shaderGroup *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  
  this->sampling_tesselation_evaluation_shader = (shaderDefinition *)0x0;
  this->sampling_vertex_shader = (shaderDefinition *)0x0;
  this->sampling_geometry_shader = (shaderDefinition *)0x0;
  this->sampling_tesselation_control_shader = (shaderDefinition *)0x0;
  this->sampling_compute_shader = (shaderDefinition *)0x0;
  this->sampling_fragment_shader = (shaderDefinition *)0x0;
  this->pass_through_tesselation_evaluation_shader = (shaderDefinition *)0x0;
  this->pass_through_vertex_shader = (shaderDefinition *)0x0;
  this->pass_through_fragment_shader = (shaderDefinition *)0x0;
  this->pass_through_tesselation_control_shader = (shaderDefinition *)0x0;
  return in_EAX;
}

Assistant:

void TextureCubeMapArraySamplingTest::shaderGroup::init()
{
	pass_through_fragment_shader			   = 0;
	pass_through_tesselation_control_shader	= 0;
	pass_through_tesselation_evaluation_shader = 0;
	pass_through_vertex_shader				   = 0;
	sampling_compute_shader					   = 0;
	sampling_fragment_shader				   = 0;
	sampling_geometry_shader				   = 0;
	sampling_tesselation_control_shader		   = 0;
	sampling_tesselation_evaluation_shader	 = 0;
	sampling_vertex_shader					   = 0;
}